

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O0

pair<llvm::NoneType,_bool> __thiscall
llvm::SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_>::insert
          (SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *this,
          pair<int,_int> *V)

{
  void *pvVar1;
  bool bVar2;
  pair<llvm::NoneType,_bool> pVar3;
  VIterator ppVar4;
  size_t sVar5;
  reference __x;
  pair<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_bool> pVar6;
  bool local_81;
  _Base_ptr local_80;
  undefined1 local_78;
  _Base_ptr local_70;
  undefined1 local_68;
  bool local_5a;
  bool local_59;
  VIterator local_58;
  VIterator I;
  undefined1 local_48;
  _Base_ptr local_40;
  bool local_38 [8];
  value_type *local_30;
  pair<int,_int> *V_local;
  SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *this_local;
  SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *local_18;
  SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *local_10;
  
  local_30 = V;
  V_local = (pair<int,_int> *)this;
  bVar2 = isSmall(this);
  if (bVar2) {
    ppVar4 = vfind(this,local_30);
    pvVar1 = (this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
             super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
             super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase.BeginX
    ;
    local_58 = ppVar4;
    local_18 = this;
    local_10 = this;
    sVar5 = SmallVectorBase::size((SmallVectorBase *)this);
    if (ppVar4 == (VIterator)((long)pvVar1 + sVar5 * 8)) {
      sVar5 = SmallVectorBase::size((SmallVectorBase *)this);
      if (sVar5 < 0x20) {
        SmallVectorTemplateBase<std::pair<int,_int>,_true>::push_back
                  ((SmallVectorTemplateBase<std::pair<int,_int>,_true> *)this,local_30);
        local_5a = true;
        pVar3 = std::make_pair<llvm::NoneType_const&,bool>(&None,&local_5a);
        this_local._0_4_ = pVar3.first;
        this_local._4_4_ = CONCAT31(this_local._5_3_,pVar3.second);
      }
      else {
        while (bVar2 = SmallVectorBase::empty((SmallVectorBase *)this), ((bVar2 ^ 0xffU) & 1) != 0)
        {
          __x = SmallVectorTemplateCommon<std::pair<int,_int>,_void>::back
                          ((SmallVectorTemplateCommon<std::pair<int,_int>,_void> *)this);
          pVar6 = std::
                  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                  ::insert(&this->Set,__x);
          local_70 = (_Base_ptr)pVar6.first._M_node;
          local_68 = pVar6.second;
          SmallVectorTemplateBase<std::pair<int,_int>,_true>::pop_back
                    ((SmallVectorTemplateBase<std::pair<int,_int>,_true> *)this);
        }
        pVar6 = std::
                set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                ::insert(&this->Set,local_30);
        local_80 = (_Base_ptr)pVar6.first._M_node;
        local_78 = pVar6.second;
        local_81 = true;
        pVar3 = std::make_pair<llvm::NoneType_const&,bool>(&None,&local_81);
        this_local._0_4_ = pVar3.first;
        this_local._4_4_ = CONCAT31(this_local._5_3_,pVar3.second);
      }
    }
    else {
      local_59 = false;
      pVar3 = std::make_pair<llvm::NoneType_const&,bool>(&None,&local_59);
      this_local._0_4_ = pVar3.first;
      this_local._4_4_ = CONCAT31(this_local._5_3_,pVar3.second);
    }
  }
  else {
    pVar6 = std::
            set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            ::insert(&this->Set,local_30);
    I = (VIterator)pVar6.first._M_node;
    local_48 = pVar6.second;
    local_40 = (_Base_ptr)I;
    local_38[0] = (bool)local_48;
    pVar3 = std::make_pair<llvm::NoneType_const&,bool>(&None,local_38);
    this_local._0_4_ = pVar3.first;
    this_local._4_4_ = CONCAT31(this_local._5_3_,pVar3.second);
  }
  pVar3._4_4_ = this_local._4_4_;
  pVar3.first = (NoneType)this_local;
  return pVar3;
}

Assistant:

std::pair<NoneType, bool> insert(const T &V) {
    if (!isSmall())
      return std::make_pair(None, Set.insert(V).second);

    VIterator I = vfind(V);
    if (I != Vector.end())    // Don't reinsert if it already exists.
      return std::make_pair(None, false);
    if (Vector.size() < N) {
      Vector.push_back(V);
      return std::make_pair(None, true);
    }

    // Otherwise, grow from vector to set.
    while (!Vector.empty()) {
      Set.insert(Vector.back());
      Vector.pop_back();
    }
    Set.insert(V);
    return std::make_pair(None, true);
  }